

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressed_materialization.cpp
# Opt level: O0

void __thiscall
duckdb::CompressedMaterialization::CreateDecompressProjection
          (CompressedMaterialization *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op,CompressedMaterializationInfo *info)

{
  ulong uVar1;
  bool bVar2;
  pointer pLVar3;
  size_type sVar4;
  pointer ptr_p;
  pointer this_00;
  type a;
  LogicalOperator *pLVar5;
  BaseStatistics *pBVar6;
  optional_ptr *this_01;
  pointer ptr_p_00;
  undefined8 in_RDX;
  long in_RDI;
  value_type *new_type;
  value_type *new_binding;
  value_type *old_binding;
  idx_t col_idx_1;
  vector<duckdb::ReplacementBinding,_true> *replacement_bindings;
  ColumnBindingReplacer replacer;
  vector<duckdb::LogicalType,_true> *new_types;
  vector<duckdb::ColumnBinding,_true> new_bindings;
  templated_unique_single_t decompress_projection;
  idx_t table_index;
  CMBindingInfo *binding_info;
  pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo> *entry;
  iterator __end2;
  iterator __begin2;
  column_binding_map_t<CMBindingInfo> *__range2;
  optional_ptr<duckdb::BaseStatistics,_true> stats;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> decompress_expr;
  value_type *binding;
  idx_t col_idx;
  vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_true> statistics;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  decompress_exprs;
  column_binding_map_t<CMBindingInfo> *binding_map;
  vector<duckdb::LogicalType,_true> *types;
  vector<duckdb::ColumnBinding,_true> bindings;
  LogicalOperator *in_stack_fffffffffffffd68;
  Binder *in_stack_fffffffffffffd70;
  LogicalType *in_stack_fffffffffffffd78;
  BaseStatistics *in_stack_fffffffffffffd80;
  ColumnBinding *in_stack_fffffffffffffd88;
  undefined7 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd97;
  BaseStatistics *this_02;
  ColumnBinding *in_stack_fffffffffffffdc0;
  LogicalType *in_stack_fffffffffffffdc8;
  BaseStatistics *in_stack_fffffffffffffdf0;
  LogicalType *in_stack_fffffffffffffdf8;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
  *in_stack_fffffffffffffe00;
  CompressedMaterialization *in_stack_fffffffffffffe08;
  optional_ptr<duckdb::LogicalOperator,_true> local_188 [2];
  reference local_178;
  reference local_170;
  const_reference local_168;
  BaseStatistics *local_160;
  undefined1 *local_158;
  undefined1 auStack_148 [24];
  LogicalOperator *local_130;
  vector<duckdb::LogicalType,_true> *local_128;
  undefined1 local_120 [28];
  undefined4 local_104;
  undefined8 local_100;
  idx_t local_e8;
  optional_ptr<duckdb::BaseStatistics,_true> local_d0;
  CMBindingInfo *local_c8;
  reference local_c0;
  _Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_true> local_b8;
  _Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_true> local_b0;
  undefined8 local_a8;
  optional_ptr<duckdb::BaseStatistics,_true> local_a0 [2];
  const_reference local_90;
  ulong local_88;
  undefined8 local_50;
  vector<duckdb::LogicalType,_true> *local_48;
  vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> local_30;
  undefined8 local_18;
  
  local_18 = in_RDX;
  pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                       *)in_stack_fffffffffffffd70);
  (*pLVar3->_vptr_LogicalOperator[2])(&local_30);
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
  operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)in_stack_fffffffffffffd70);
  LogicalOperator::ResolveOperatorTypes
            ((LogicalOperator *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
  pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                       *)in_stack_fffffffffffffd70);
  local_48 = &pLVar3->types;
  local_50 = local_18;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            *)0xcfbdfe);
  vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_true>::vector
            ((vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_true> *)0xcfbe0b);
  for (local_88 = 0; uVar1 = local_88,
      sVar4 = ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::size
                        (&local_30), uVar1 < sVar4; local_88 = local_88 + 1) {
    local_90 = vector<duckdb::ColumnBinding,_true>::operator[]
                         ((vector<duckdb::ColumnBinding,_true> *)in_stack_fffffffffffffd70,
                          (size_type)in_stack_fffffffffffffd68);
    vector<duckdb::LogicalType,_true>::operator[]
              ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffd70,
               (size_type)in_stack_fffffffffffffd68);
    make_uniq_base<duckdb::Expression,duckdb::BoundColumnRefExpression,duckdb::LogicalType_const&,duckdb::ColumnBinding_const&>
              (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
    optional_ptr<duckdb::BaseStatistics,_true>::optional_ptr(local_a0);
    local_a8 = local_50;
    local_b0._M_cur =
         (__node_type *)
         ::std::
         unordered_map<duckdb::ColumnBinding,_duckdb::CMBindingInfo,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>_>_>
         ::begin((unordered_map<duckdb::ColumnBinding,_duckdb::CMBindingInfo,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>_>_>
                  *)in_stack_fffffffffffffd68);
    local_b8._M_cur =
         (__node_type *)
         ::std::
         unordered_map<duckdb::ColumnBinding,_duckdb::CMBindingInfo,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>_>_>
         ::end((unordered_map<duckdb::ColumnBinding,_duckdb::CMBindingInfo,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>_>_>
                *)in_stack_fffffffffffffd68);
    while (bVar2 = ::std::__detail::operator!=(&local_b0,&local_b8), bVar2) {
      local_c0 = ::std::__detail::
                 _Node_iterator<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_false,_true>
                 ::operator*((_Node_iterator<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_false,_true>
                              *)0xcfbf27);
      local_c8 = &local_c0->second;
      bVar2 = ColumnBinding::operator!=
                        ((ColumnBinding *)in_stack_fffffffffffffd70,
                         (ColumnBinding *)in_stack_fffffffffffffd68);
      if (!bVar2) {
        ptr_p = ::std::
                unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
                get((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                     *)in_stack_fffffffffffffd70);
        optional_ptr<duckdb::BaseStatistics,_true>::optional_ptr(&local_d0,ptr_p);
        local_a0[0].ptr = local_d0.ptr;
        if ((local_c8->needs_decompression & 1U) != 0) {
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::unique_ptr
                    ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)in_stack_fffffffffffffd70,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)in_stack_fffffffffffffd68);
          optional_ptr<duckdb::BaseStatistics,_true>::operator*
                    ((optional_ptr<duckdb::BaseStatistics,_true> *)in_stack_fffffffffffffd70);
          GetDecompressExpression
                    (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                     in_stack_fffffffffffffdf0);
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
                    ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)in_stack_fffffffffffffd70,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)in_stack_fffffffffffffd68);
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                    ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)0xcfc094);
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                    ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)0xcfc0a1);
        }
      }
      ::std::__detail::
      _Node_iterator<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_false,_true>::
      operator++((_Node_iterator<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_false,_true>
                  *)in_stack_fffffffffffffd70);
    }
    ::std::
    vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BaseStatistics,_true>_>_>
    ::push_back((vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BaseStatistics,_true>_>_>
                 *)in_stack_fffffffffffffd80,(value_type *)in_stack_fffffffffffffd78);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                *)in_stack_fffffffffffffd80,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffd78);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               0xcfc115);
  }
  local_e8 = Binder::GenerateTableIndex(in_stack_fffffffffffffd70);
  make_uniq<duckdb::LogicalProjection,unsigned_long_const&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
            ((unsigned_long *)in_stack_fffffffffffffdc8,
             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)in_stack_fffffffffffffdc0);
  pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                       *)in_stack_fffffffffffffd70);
  if ((pLVar3->has_estimated_cardinality & 1U) != 0) {
    this_00 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
              ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                            *)in_stack_fffffffffffffd70);
    pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)in_stack_fffffffffffffd70);
    LogicalOperator::SetEstimatedCardinality
              (&this_00->super_LogicalOperator,pLVar3->estimated_cardinality);
  }
  unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>::
  operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
              *)in_stack_fffffffffffffd70);
  ::std::
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
            ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
              *)in_stack_fffffffffffffd80,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)in_stack_fffffffffffffd78);
  unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>::
  unique_ptr<duckdb::LogicalProjection,std::default_delete<std::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>>>,void>
            ((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)in_stack_fffffffffffffd70,
             (unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>_>
              *)in_stack_fffffffffffffd68);
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::operator=
            ((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)in_stack_fffffffffffffd70,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)in_stack_fffffffffffffd68);
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
  ~unique_ptr((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *)0xcfc287);
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
  operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)in_stack_fffffffffffffd70);
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                *)in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68);
  a = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
      operator*((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 *)in_stack_fffffffffffffd70);
  pLVar5 = optional_ptr<duckdb::LogicalOperator,_true>::operator*
                     ((optional_ptr<duckdb::LogicalOperator,_true> *)in_stack_fffffffffffffd70);
  bVar2 = RefersToSameObject<duckdb::LogicalOperator>(a,pLVar5);
  if (bVar2) {
    optional_ptr<duckdb::LogicalOperator,_true>::optional_ptr
              ((optional_ptr<duckdb::LogicalOperator,_true> *)in_stack_fffffffffffffd70,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)in_stack_fffffffffffffd68);
    *(undefined8 *)(in_RDI + 0x10) = local_100;
    local_104 = 1;
  }
  else {
    pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)in_stack_fffffffffffffd70);
    (*pLVar3->_vptr_LogicalOperator[2])(local_120);
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)in_stack_fffffffffffffd70);
    LogicalOperator::ResolveOperatorTypes
              ((LogicalOperator *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
    pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)in_stack_fffffffffffffd70);
    local_128 = &pLVar3->types;
    ColumnBindingReplacer::ColumnBindingReplacer((ColumnBindingReplacer *)in_stack_fffffffffffffd70)
    ;
    local_158 = auStack_148;
    local_160 = (BaseStatistics *)0x0;
    while (this_02 = local_160,
          pBVar6 = (BaseStatistics *)
                   ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
                   size(&local_30), this_02 < pBVar6) {
      local_168 = vector<duckdb::ColumnBinding,_true>::operator[]
                            ((vector<duckdb::ColumnBinding,_true> *)in_stack_fffffffffffffd70,
                             (size_type)in_stack_fffffffffffffd68);
      local_170 = vector<duckdb::ColumnBinding,_true>::operator[]
                            ((vector<duckdb::ColumnBinding,_true> *)in_stack_fffffffffffffd70,
                             (size_type)in_stack_fffffffffffffd68);
      local_178 = vector<duckdb::LogicalType,_true>::operator[]
                            ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffd70,
                             (size_type)in_stack_fffffffffffffd68);
      ::std::vector<duckdb::ReplacementBinding,std::allocator<duckdb::ReplacementBinding>>::
      emplace_back<duckdb::ColumnBinding_const&,duckdb::ColumnBinding_const&,duckdb::LogicalType_const&>
                ((vector<duckdb::ReplacementBinding,_std::allocator<duckdb::ReplacementBinding>_> *)
                 CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                 in_stack_fffffffffffffd88,(ColumnBinding *)in_stack_fffffffffffffd80,
                 in_stack_fffffffffffffd78);
      this_01 = (optional_ptr *)
                vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_true>::operator[]
                          ((vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_true> *)
                           in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68);
      in_stack_fffffffffffffd97 = duckdb::optional_ptr::operator_cast_to_bool(this_01);
      if ((bool)in_stack_fffffffffffffd97) {
        in_stack_fffffffffffffd88 =
             (ColumnBinding *)
             vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_true>::operator[]
                       ((vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_true> *)
                        in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68);
        in_stack_fffffffffffffd80 =
             optional_ptr<duckdb::BaseStatistics,_true>::operator->
                       ((optional_ptr<duckdb::BaseStatistics,_true> *)in_stack_fffffffffffffd70);
        BaseStatistics::ToUnique(this_02);
        in_stack_fffffffffffffd78 =
             (LogicalType *)
             ::std::
             unordered_map<duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>_>
             ::operator[]((unordered_map<duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>_>
                           *)in_stack_fffffffffffffd70,(key_type *)in_stack_fffffffffffffd68);
        unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
        operator=((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                   *)in_stack_fffffffffffffd70,
                  (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                   *)in_stack_fffffffffffffd68);
        unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
        ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                     *)0xcfc56f);
      }
      local_160 = (BaseStatistics *)&(local_160->type).physical_type_;
    }
    ptr_p_00 = std::
               unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>::
               get((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    *)in_stack_fffffffffffffd70);
    optional_ptr<duckdb::LogicalOperator,_true>::optional_ptr(local_188,ptr_p_00);
    local_130 = local_188[0].ptr;
    pLVar5 = optional_ptr<duckdb::LogicalOperator,_true>::operator*
                       ((optional_ptr<duckdb::LogicalOperator,_true> *)in_stack_fffffffffffffd70);
    ColumnBindingReplacer::VisitOperator((ColumnBindingReplacer *)pLVar5,in_stack_fffffffffffffd68);
    ColumnBindingReplacer::~ColumnBindingReplacer((ColumnBindingReplacer *)pLVar5);
    vector<duckdb::ColumnBinding,_true>::~vector((vector<duckdb::ColumnBinding,_true> *)0xcfc659);
    local_104 = 0;
  }
  unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>::
  ~unique_ptr((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
               *)0xcfc671);
  vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_true>::~vector
            ((vector<duckdb::optional_ptr<duckdb::BaseStatistics,_true>,_true> *)0xcfc67e);
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             *)0xcfc68b);
  vector<duckdb::ColumnBinding,_true>::~vector((vector<duckdb::ColumnBinding,_true> *)0xcfc698);
  return;
}

Assistant:

void CompressedMaterialization::CreateDecompressProjection(unique_ptr<LogicalOperator> &op,
                                                           CompressedMaterializationInfo &info) {
	const auto bindings = op->GetColumnBindings();
	op->ResolveOperatorTypes();
	const auto &types = op->types;

	// Create decompress expressions for everything we compressed
	auto &binding_map = info.binding_map;
	vector<unique_ptr<Expression>> decompress_exprs;
	vector<optional_ptr<BaseStatistics>> statistics;
	for (idx_t col_idx = 0; col_idx < bindings.size(); col_idx++) {
		const auto &binding = bindings[col_idx];
		auto decompress_expr = make_uniq_base<Expression, BoundColumnRefExpression>(types[col_idx], binding);
		optional_ptr<BaseStatistics> stats;
		for (auto &entry : binding_map) {
			auto &binding_info = entry.second;
			if (binding_info.binding != binding) {
				continue;
			}
			stats = binding_info.stats.get();
			if (binding_info.needs_decompression) {
				decompress_expr = GetDecompressExpression(std::move(decompress_expr), binding_info.type, *stats);
			}
		}
		statistics.push_back(stats);
		decompress_exprs.emplace_back(std::move(decompress_expr));
	}

	// Replace op with a projection
	const auto table_index = optimizer.binder.GenerateTableIndex();
	auto decompress_projection = make_uniq<LogicalProjection>(table_index, std::move(decompress_exprs));
	if (op->has_estimated_cardinality) {
		decompress_projection->SetEstimatedCardinality(op->estimated_cardinality);
	}

	decompress_projection->children.emplace_back(std::move(op));
	op = std::move(decompress_projection);

	// Check if we're placing a projection on top of the root
	if (RefersToSameObject(*op->children[0], *root)) {
		root = op;
		return;
	}

	// Get the new bindings and types
	auto new_bindings = op->GetColumnBindings();
	op->ResolveOperatorTypes();
	auto &new_types = op->types;

	// Initialize a ColumnBindingReplacer with the new bindings and types
	ColumnBindingReplacer replacer;
	auto &replacement_bindings = replacer.replacement_bindings;
	for (idx_t col_idx = 0; col_idx < bindings.size(); col_idx++) {
		const auto &old_binding = bindings[col_idx];
		const auto &new_binding = new_bindings[col_idx];
		const auto &new_type = new_types[col_idx];
		replacement_bindings.emplace_back(old_binding, new_binding, new_type);

		if (statistics[col_idx]) {
			statistics_map[new_binding] = statistics[col_idx]->ToUnique();
		}
	}

	// Make sure we skip the decompress operator when replacing bindings
	replacer.stop_operator = op.get();

	// Make the plan consistent again
	replacer.VisitOperator(*root);
}